

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O3

void __thiscall
wasm::TopologicalOrdersImpl<std::less<unsigned_int>_>::pushChoice
          (TopologicalOrdersImpl<std::less<unsigned_int>_> *this,Index choice)

{
  ulong uVar1;
  uint uVar2;
  iterator __position;
  pointer puVar3;
  ulong uVar4;
  uint *puVar5;
  long lVar6;
  ulong uVar7;
  Index local_1c [2];
  Index choice_local;
  
  __position._M_current =
       (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_1c[0] = choice;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->choiceHeap,__position,
               local_1c);
    puVar5 = (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = choice;
    puVar5 = __position._M_current + 1;
    (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  puVar3 = (this->choiceHeap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = puVar5[-1];
  lVar6 = (long)puVar5 - (long)puVar3 >> 2;
  uVar4 = lVar6 - 1;
  if (1 < lVar6) {
    do {
      uVar1 = uVar4 - 1;
      uVar7 = uVar1 >> 1;
      if (puVar3[uVar7] <= uVar2) goto LAB_001d593a;
      puVar3[uVar4] = puVar3[uVar7];
      uVar4 = uVar7;
    } while (1 < uVar1);
    uVar4 = 0;
  }
LAB_001d593a:
  puVar3[uVar4] = uVar2;
  return;
}

Assistant:

void pushChoice(Index choice) {
    choiceHeap.push_back(choice);
    std::push_heap(choiceHeap.begin(), choiceHeap.end(), [&](Index a, Index b) {
      return cmp(b, a);
    });
  }